

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O3

shared_ptr<mocker::ir::Addr> __thiscall mocker::ir::Builder::makeILit(Builder *this,Integer val)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  BuilderContext *pBVar1;
  undefined8 in_RDX;
  shared_ptr<mocker::ir::Addr> sVar2;
  
  pBVar1 = (BuilderContext *)operator_new(0x20);
  (pBVar1->logicalExprInfo).trueNext._M_node = (_List_node_base *)0x100000001;
  *(undefined ***)&pBVar1->logicalExprInfo = &PTR___Sp_counted_ptr_inplace_001e9d60;
  (pBVar1->logicalExprInfo).falseNext._M_node = (_List_node_base *)&PTR__Addr_001e9db0;
  *(undefined8 *)&(pBVar1->logicalExprInfo).inCondition = in_RDX;
  *(BBLIter **)this = &(pBVar1->logicalExprInfo).falseNext;
  this->ctx = pBVar1;
  sVar2.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR__Addr_001e9db0;
  sVar2.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::ir::Addr>)
         sVar2.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Addr> Builder::makeILit(Integer val) const {
  return std::make_shared<IntLiteral>(val);
}